

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O2

Generator * __thiscall kratos::Stmt::generator_parent(Stmt *this)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Generator *pGVar3;
  uint32_t i;
  uint uVar4;
  __shared_ptr<kratos::IterVar,_(__gnu_cxx::_Lock_policy)2> local_28;
  IRNode *pIVar2;
  
  uVar4 = 0;
  pIVar2 = this->parent_;
  while ((uVar4 < 100000 && (pIVar2 != (IRNode *)0x0))) {
    if (pIVar2->ast_node_type_ == GeneratorKind) goto LAB_001a08df;
    iVar1 = (*pIVar2->_vptr_IRNode[4])();
    uVar4 = uVar4 + 1;
    pIVar2 = (IRNode *)CONCAT44(extraout_var,iVar1);
  }
  if ((pIVar2 == (IRNode *)0x0) || (pIVar2->ast_node_type_ != GeneratorKind)) {
    if ((((this->type_ == Block) && (pIVar2 = this->parent_, pIVar2 != (IRNode *)0x0)) &&
        (pIVar2->ast_node_type_ == StmtKind)) &&
       (*(int *)&pIVar2[1].fn_name_ln.
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish == 2)) {
      std::__shared_ptr<kratos::IterVar,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_28,
                 (__shared_ptr<kratos::IterVar,_(__gnu_cxx::_Lock_policy)2> *)
                 &pIVar2[1].attributes_.
                  super__Vector_base<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
      iVar1 = (*((local_28._M_ptr)->super_Var).super_IRNode._vptr_IRNode[0xd])();
      pGVar3 = (Generator *)CONCAT44(extraout_var_00,iVar1);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
    }
    else {
      pGVar3 = (Generator *)0x0;
    }
    return pGVar3;
  }
LAB_001a08df:
  pGVar3 = (Generator *)__dynamic_cast(pIVar2,&IRNode::typeinfo,&Generator::typeinfo,0);
  return pGVar3;
}

Assistant:

Generator *Stmt::generator_parent() const {
    IRNode *p = parent_;
    // we don't do while loop here to prevent infinite loop
    // 100000 is sufficient for almost all designs.
    for (uint32_t i = 0; i < 100000u && p; i++) {
        if (p->ir_node_kind() != IRNodeKind::GeneratorKind) {
            p = p->parent();
        } else {
            break;
        }
    }
    if (!p || p->ir_node_kind() != IRNodeKind::GeneratorKind) {
        // special case for nested for loop
        if (type() == StatementType::Block && parent_ &&
            parent_->ir_node_kind() == IRNodeKind::StmtKind &&
            reinterpret_cast<Stmt *>(parent_)->type() == StatementType::For) {
            // take the best shot
            auto *for_ = reinterpret_cast<ForStmt *>(parent_);
            return for_->get_iter_var()->generator();
        }
        return nullptr;
    }
    return dynamic_cast<Generator *>(p);
}